

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp.cc
# Opt level: O2

RunResult __thiscall wabt::interp::Thread::DoTableGrow(Thread *this,Instr instr,Ptr *out_trap)

{
  pointer pRVar1;
  pointer pRVar2;
  Result RVar3;
  u64 uVar4;
  Value VVar5;
  Ptr table;
  
  RefPtr<wabt::interp::Table>::RefPtr
            (&table,this->store_,
             (Ref)(this->inst_->tables_).
                  super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>._M_impl.
                  super__Vector_impl_data._M_start[instr.field_2.imm_u32].index);
  pRVar1 = ((table.obj_)->elements_).
           super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>._M_impl.
           super__Vector_impl_data._M_finish;
  pRVar2 = ((table.obj_)->elements_).
           super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>._M_impl.
           super__Vector_impl_data._M_start;
  uVar4 = PopPtr(this,&table);
  VVar5 = Pop(this);
  RVar3 = Table::Grow(table.obj_,this->store_,(u32)uVar4,VVar5.field_0.ref_.index);
  uVar4 = 0xffffffffffffffff;
  if (RVar3.enum_ != Error) {
    uVar4 = (ulong)((long)pRVar1 - (long)pRVar2) >> 3 & 0xffffffff;
  }
  PushPtr(this,&table,uVar4);
  RefPtr<wabt::interp::Table>::reset(&table);
  return Ok;
}

Assistant:

RunResult Thread::DoTableGrow(Instr instr, Trap::Ptr* out_trap) {
  Table::Ptr table{store_, inst_->tables()[instr.imm_u32]};
  u32 old_size = table->size();
  auto delta = PopPtr(table);
  auto ref = Pop<Ref>();
  if (Failed(table->Grow(store_, delta, ref))) {
    PushPtr(table, -1);
  } else {
    PushPtr(table, old_size);
  }
  return RunResult::Ok;
}